

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

void __thiscall
ON_SimpleArray<ON__CNewMeshFace>::Append(ON_SimpleArray<ON__CNewMeshFace> *this,ON__CNewMeshFace *x)

{
  float *pfVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ON_2fPoint OVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  float fVar11;
  uint uVar12;
  ON__CNewMeshFace *pOVar13;
  ON__CNewMeshFace *pOVar14;
  uint uVar15;
  
  uVar12 = this->m_count;
  pOVar13 = x;
  if (uVar12 == this->m_capacity) {
    if (((int)uVar12 < 8) || ((ulong)((long)(int)uVar12 * 0x2c) < 0x10000001)) {
      uVar15 = 4;
      if (2 < (int)uVar12) {
        uVar15 = uVar12 * 2;
      }
    }
    else {
      uVar15 = 0x5d174d;
      if (uVar12 < 0x5d174d) {
        uVar15 = uVar12;
      }
      uVar15 = uVar15 + uVar12;
    }
    if (x < this->m_a + (int)uVar12 && this->m_a <= x) {
      pOVar13 = (ON__CNewMeshFace *)onmalloc(0x2c);
      iVar5 = x->fi;
      iVar6 = x->newvcnt;
      bVar7 = x->bNewV[0];
      bVar8 = x->bNewV[1];
      bVar9 = x->bNewV[2];
      bVar10 = x->bNewV[3];
      fVar11 = x->tc[0].x;
      uVar2 = *(undefined8 *)&x->tc[0].y;
      uVar3 = *(undefined8 *)&x->tc[1].y;
      OVar4 = x->tc[3];
      pOVar13->tc[2] = x->tc[2];
      pOVar13->tc[3] = OVar4;
      *(undefined8 *)&pOVar13->tc[0].y = uVar2;
      *(undefined8 *)&pOVar13->tc[1].y = uVar3;
      pOVar13->fi = iVar5;
      pOVar13->newvcnt = iVar6;
      pOVar13->bNewV[0] = bVar7;
      pOVar13->bNewV[1] = bVar8;
      pOVar13->bNewV[2] = bVar9;
      pOVar13->bNewV[3] = bVar10;
      pOVar13->tc[0].x = fVar11;
      uVar12 = this->m_capacity;
    }
    if (uVar12 < uVar15) {
      SetCapacity(this,(long)(int)uVar15);
    }
    pOVar14 = this->m_a;
    if (pOVar14 == (ON__CNewMeshFace *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
    uVar12 = this->m_count;
  }
  else {
    pOVar14 = this->m_a;
  }
  this->m_count = uVar12 + 1;
  iVar5 = pOVar13->fi;
  iVar6 = pOVar13->newvcnt;
  bVar7 = pOVar13->bNewV[0];
  bVar8 = pOVar13->bNewV[1];
  bVar9 = pOVar13->bNewV[2];
  bVar10 = pOVar13->bNewV[3];
  fVar11 = pOVar13->tc[0].x;
  uVar2 = *(undefined8 *)&pOVar13->tc[0].y;
  uVar3 = *(undefined8 *)&pOVar13->tc[1].y;
  OVar4 = pOVar13->tc[3];
  pOVar14[(int)uVar12].tc[2] = pOVar13->tc[2];
  (pOVar14[(int)uVar12].tc + 2)[1] = OVar4;
  pfVar1 = &pOVar14[(int)uVar12].tc[0].y;
  *(undefined8 *)pfVar1 = uVar2;
  *(undefined8 *)(pfVar1 + 2) = uVar3;
  pOVar14 = pOVar14 + (int)uVar12;
  pOVar14->fi = iVar5;
  pOVar14->newvcnt = iVar6;
  pOVar14->bNewV[0] = bVar7;
  pOVar14->bNewV[1] = bVar8;
  pOVar14->bNewV[2] = bVar9;
  pOVar14->bNewV[3] = bVar10;
  pOVar14->tc[0].x = fVar11;
  if (pOVar13 != x) {
    onfree(pOVar13);
    return;
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}